

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_font * nk_font_atlas_add_from_memory
                    (nk_font_atlas *atlas,void *memory,nk_size size,float height,
                    nk_font_config *config)

{
  nk_font *pnVar1;
  long lVar2;
  nk_font_config *pnVar3;
  nk_font_config cfg;
  nk_font_config local_58;
  
  if ((atlas == (nk_font_atlas *)0x0) || ((atlas->temporary).alloc == (nk_plugin_alloc)0x0)) {
    return (nk_font *)0x0;
  }
  pnVar1 = (nk_font *)0x0;
  if ((size != 0) && ((memory != (void *)0x0 && ((atlas->temporary).free != (nk_plugin_free)0x0))))
  {
    if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
      return (nk_font *)0x0;
    }
    if ((atlas->permanent).free == (nk_plugin_free)0x0) {
      return (nk_font *)0x0;
    }
    if (config == (nk_font_config *)0x0) {
      local_58.merge_mode = '\0';
      local_58.pixel_snap = '\0';
      local_58.next = (nk_font_config *)0x0;
      local_58.padding[2] = '\0';
      local_58.oversample_v = '\x01';
      local_58.oversample_h = '\x03';
      local_58.padding[0] = '\0';
      local_58.padding[1] = '\0';
      local_58.coord_type = NK_COORD_UV;
      local_58.spacing.x = 0.0;
      local_58.spacing.y = 0.0;
      local_58.range = nk_font_default_glyph_ranges::ranges;
      local_58.font = (nk_baked_font *)0x0;
      local_58.fallback_glyph = 0x3f;
      local_58._68_8_ = 0;
      local_58._76_8_ = 0;
      local_58.p._4_4_ = 0;
    }
    else {
      pnVar3 = &local_58;
      for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
        pnVar3->next = config->next;
        config = (nk_font_config *)&config->ttf_blob;
        pnVar3 = (nk_font_config *)((long)pnVar3 + 8);
      }
    }
    local_58.ttf_blob._0_3_ = SUB83(memory,0);
    local_58.ttf_blob._3_5_ = (undefined5)((ulong)memory >> 0x18);
    local_58.ttf_size._0_3_ = (undefined3)size;
    local_58.ttf_size._3_5_ = (undefined5)(size >> 0x18);
    local_58.ttf_data_owned_by_atlas = '\0';
    local_58.size = height;
    pnVar1 = nk_font_atlas_add(atlas,&local_58);
  }
  return pnVar1;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_from_memory(struct nk_font_atlas *atlas, void *memory,
nk_size size, float height, const struct nk_font_config *config)
{
struct nk_font_config cfg;
NK_ASSERT(memory);
NK_ASSERT(size);

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);
if (!atlas || !atlas->temporary.alloc || !atlas->temporary.free || !memory || !size ||
!atlas->permanent.alloc || !atlas->permanent.free)
return 0;

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = memory;
cfg.ttf_size = size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 0;
return nk_font_atlas_add(atlas, &cfg);
}